

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supplies.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Supplies::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Supplies *this)

{
  ostream *poVar1;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Supplies *local_18;
  Supplies *this_local;
  
  local_18 = this;
  this_local = (Supplies *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  EntityType::GetAsString_abi_cxx11_(&local_1c0,&this->super_EntityType);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"Quantity:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Quantity);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Supplies::GetAsString() const
{
    KStringStream ss;

    ss << EntityType::GetAsString()
       << "Quantity:   " << m_f32Quantity
       << "\n";

    return ss.str();
}